

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterBuffer.h
# Opt level: O0

hash_t __thiscall JsUtil::CharacterBuffer::operator_cast_to_unsigned_int(CharacterBuffer *this)

{
  code *pcVar1;
  bool bVar2;
  hash_t hVar3;
  char16_t **ppcVar4;
  undefined4 *puVar5;
  CharacterBuffer<char16_t> *this_local;
  
  ppcVar4 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)this);
  if (*ppcVar4 == (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/CharacterBuffer.h"
                       ,0x20,"(string != nullptr)","string != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppcVar4 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)this);
  hVar3 = CharacterBuffer<char16_t>::StaticGetHashCode(*ppcVar4,*(charcount_t *)(this + 8));
  return hVar3;
}

Assistant:

operator hash_t() const
        {
            Assert(string != nullptr);
            return StaticGetHashCode(string, len);
        }